

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_1008165::HandleRegexCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pbVar3;
  pointer pbVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  cmExecutionStatus *pcVar8;
  _Alloc_hider _Var9;
  char *pcVar10;
  char *pcVar11;
  bool bVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  undefined8 s;
  char *pcVar14;
  string_view value;
  string_view value_00;
  string_view value_01;
  string output;
  string e_2;
  string input;
  string e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 local_220 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200 [2];
  cmExecutionStatus *local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  pointer local_1b8;
  string *local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  cmStringReplaceHelper local_188;
  
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_188,"sub-command REGEX requires a mode to be specified.",
               (allocator<char> *)local_200[0]._M_local_buf);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_0032c1cd;
  }
  pbVar13 = pbVar4 + 1;
  bVar12 = std::operator==(pbVar13,"MATCH");
  if (bVar12) {
    pbVar4 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4) < 0x81) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_188,
                 "sub-command REGEX, mode MATCH needs at least 5 arguments total to command.",
                 (allocator<char> *)local_200[0]._M_local_buf);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_0032c1cd;
    }
    psVar1 = pbVar4 + 2;
    cmMakefile::ClearMatches(status->Makefile);
    local_188.RegularExpression.regmatch.endp[4] = (char *)0x0;
    local_188.RegularExpression.regmatch.endp[6] = (char *)0x0;
    local_188.RegularExpression.regmatch.endp[7]._0_4_ = 0;
    memset(&local_188,0,0xaa);
    bVar12 = cmsys::RegularExpression::compile((RegularExpression *)&local_188,psVar1);
    if (!bVar12) {
      std::operator+(&local_240,"sub-command REGEX, mode MATCH failed to compile regex \"",psVar1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                     &local_240,"\".");
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_0032c784:
      std::__cxx11::string::~string((string *)local_200[0]._M_local_buf);
      bVar12 = false;
      goto LAB_0032c8c9;
    }
    local_220._8_8_ =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_220._0_8_ =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start + 4;
    paVar2 = &local_240.field_2;
    local_240._M_string_length = 0;
    local_240.field_2._M_local_buf[0] = '\0';
    auVar5._8_8_ = 0;
    auVar5._0_8_ = paVar2;
    local_240._M_dataplus._M_p = (pointer)paVar2;
    cmJoin((string *)local_200,(cmStringRange *)local_220,(string_view)(auVar5 << 0x40),
           (string_view)ZEXT816(0));
    std::__cxx11::string::~string((string *)&local_240);
    local_240._M_string_length = 0;
    local_240.field_2._M_local_buf[0] = '\0';
    local_240._M_dataplus._M_p = (pointer)paVar2;
    bVar12 = cmsys::RegularExpression::find
                       ((RegularExpression *)&local_188,(char *)local_200[0]._0_8_);
    if (bVar12) {
      cmMakefile::StoreMatches(status->Makefile,(RegularExpression *)&local_188);
      if (local_188.RegularExpression.regmatch.startp[2] == local_188.ErrorString._M_dataplus._M_p)
      {
        std::operator+(&local_1d8,"sub-command REGEX, mode MATCH regex \"",psVar1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_220,&local_1d8,"\" matched an empty string.");
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        std::__cxx11::string::~string((string *)local_220);
        bVar12 = false;
        goto LAB_0032c8b5;
      }
      std::__cxx11::string::substr((ulong)local_220,(ulong)local_200);
      std::__cxx11::string::operator=((string *)&local_240,(string *)local_220);
      std::__cxx11::string::~string((string *)local_220);
    }
    bVar12 = true;
    value._M_str = local_240._M_dataplus._M_p;
    value._M_len = local_240._M_string_length;
    cmMakefile::AddDefinition(status->Makefile,pbVar4 + 3,value);
  }
  else {
    bVar12 = std::operator==(pbVar13,"MATCHALL");
    if (!bVar12) {
      bVar12 = std::operator==(pbVar13,"REPLACE");
      if (!bVar12) {
        std::operator+(&local_188.ErrorString,"sub-command REGEX does not recognize mode ",pbVar13);
        std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_0032c1cd:
        std::__cxx11::string::~string((string *)&local_188);
        return false;
      }
      pbVar4 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4) < 0xc0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_188,
                   "sub-command REGEX, mode REPLACE needs at least 6 arguments total to command.",
                   (allocator<char> *)local_200[0]._M_local_buf);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_0032c1cd;
      }
      std::__cxx11::string::string((string *)local_200[0]._M_local_buf,(string *)(pbVar4 + 3));
      cmStringReplaceHelper::cmStringReplaceHelper
                (&local_188,pbVar4 + 2,(string *)local_200,status->Makefile);
      std::__cxx11::string::~string((string *)local_200[0]._M_local_buf);
      if (local_188.ValidReplaceExpression == false) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_220,"sub-command REGEX, mode REPLACE: ",&local_188.ErrorString);
        std::operator+(&local_240,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_220,".");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        std::__cxx11::string::~string((string *)&local_240);
        pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220;
      }
      else {
        cmMakefile::ClearMatches(status->Makefile);
        if (local_188.RegularExpression.program != (char *)0x0) {
          local_1d8._M_string_length =
               (size_type)
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          local_1d8._M_dataplus._M_p =
               (pointer)((args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + 5);
          pbVar3 = (pointer)(local_220 + 0x10);
          local_220._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
          ;
          local_220[0x10] = '\0';
          auVar7._8_8_ = 0;
          auVar7._0_8_ = pbVar3;
          local_220._0_8_ = pbVar3;
          cmJoin(&local_240,(cmStringRange *)&local_1d8,(string_view)(auVar7 << 0x40),
                 (string_view)ZEXT816(0));
          std::__cxx11::string::~string((string *)local_220);
          local_220._8_8_ = (pointer)0x0;
          local_220[0x10] = '\0';
          local_220._0_8_ = pbVar3;
          bVar12 = cmStringReplaceHelper::Replace(&local_188,&local_240,(string *)local_220);
          if (bVar12) {
            value_00._M_str = (char *)local_220._0_8_;
            value_00._M_len = local_220._8_8_;
            cmMakefile::AddDefinition(status->Makefile,pbVar4 + 4,value_00);
          }
          else {
            std::operator+(&local_1a8,"sub-command REGEX, mode REPLACE: ",&local_188.ErrorString);
            std::operator+(&local_1d8,&local_1a8,".");
            std::__cxx11::string::_M_assign((string *)&status->Error);
            std::__cxx11::string::~string((string *)&local_1d8);
            std::__cxx11::string::~string((string *)&local_1a8);
          }
          std::__cxx11::string::~string((string *)local_220);
          std::__cxx11::string::~string((string *)&local_240);
          goto LAB_0032c99f;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_220,"sub-command REGEX, mode REPLACE failed to compile regex \"",
                       pbVar4 + 2);
        std::operator+(&local_240,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_220,"\".");
        std::__cxx11::string::~string((string *)local_220);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        pbVar13 = &local_240;
      }
      std::__cxx11::string::~string((string *)pbVar13);
      bVar12 = false;
LAB_0032c99f:
      cmStringReplaceHelper::~cmStringReplaceHelper(&local_188);
      return bVar12;
    }
    local_1b8 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)local_1b8) < 0x81) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_188,
                 "sub-command REGEX, mode MATCHALL needs at least 5 arguments total to command.",
                 (allocator<char> *)local_200[0]._M_local_buf);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_0032c1cd;
    }
    psVar1 = local_1b8 + 2;
    cmMakefile::ClearMatches(status->Makefile);
    local_188.RegularExpression.regmatch.endp[4] = (char *)0x0;
    local_188.RegularExpression.regmatch.endp[6] = (char *)0x0;
    local_188.RegularExpression.regmatch.endp[7]._0_4_ = 0;
    memset(&local_188,0,0xaa);
    bVar12 = cmsys::RegularExpression::compile((RegularExpression *)&local_188,psVar1);
    if (!bVar12) {
      std::operator+(&local_240,"sub-command REGEX, mode MATCHALL failed to compile regex \"",psVar1
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                     &local_240,"\".");
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_0032c784;
    }
    local_220._8_8_ =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_220._0_8_ =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start + 4;
    paVar2 = &local_240.field_2;
    local_240._M_string_length = 0;
    local_240.field_2._M_local_buf[0] = '\0';
    auVar6._8_8_ = 0;
    auVar6._0_8_ = paVar2;
    local_240._M_dataplus._M_p = (pointer)paVar2;
    local_1e0 = status;
    local_1b0 = psVar1;
    cmJoin((string *)local_200,(cmStringRange *)local_220,(string_view)(auVar6 << 0x40),
           (string_view)ZEXT816(0));
    local_1b8 = local_1b8 + 3;
    std::__cxx11::string::~string((string *)&local_240);
    local_240._M_string_length = 0;
    local_240.field_2._M_local_buf[0] = '\0';
    s = local_200[0]._M_allocated_capacity;
    local_240._M_dataplus._M_p = (pointer)paVar2;
    while( true ) {
      bVar12 = cmsys::RegularExpression::find((RegularExpression *)&local_188,(char *)s);
      if (!bVar12) break;
      cmMakefile::ClearMatches(local_1e0->Makefile);
      cmMakefile::StoreMatches(local_1e0->Makefile,(RegularExpression *)&local_188);
      pcVar11 = local_188.RegularExpression.regmatch.endp[2];
      pcVar10 = local_188.RegularExpression.regmatch.startp[2];
      _Var9._M_p = local_188.ErrorString._M_dataplus._M_p;
      if (local_188.RegularExpression.regmatch.startp[2] == local_188.ErrorString._M_dataplus._M_p)
      {
        std::operator+(&local_1d8,"sub-command REGEX, mode MATCHALL regex \"",local_1b0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_220,&local_1d8,"\" matched an empty string.");
        pcVar8 = local_1e0;
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::_M_assign((string *)&pcVar8->Error);
        std::__cxx11::string::~string((string *)local_220);
        goto LAB_0032c85e;
      }
      if (local_240._M_string_length != 0) {
        std::__cxx11::string::append((char *)&local_240);
      }
      pcVar14 = (char *)(s + ((long)_Var9._M_p - (long)pcVar11));
      local_220._0_8_ = local_220 + 0x10;
      s = s + ((long)pcVar10 - (long)pcVar11);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_220,pcVar14,s);
      std::__cxx11::string::append((string *)&local_240);
      std::__cxx11::string::~string((string *)local_220);
    }
    value_01._M_str = local_240._M_dataplus._M_p;
    value_01._M_len = local_240._M_string_length;
    cmMakefile::AddDefinition(local_1e0->Makefile,local_1b8,value_01);
LAB_0032c85e:
    bVar12 = !bVar12;
  }
LAB_0032c8b5:
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)local_200[0]._M_local_buf);
LAB_0032c8c9:
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)&local_188);
  return bVar12;
}

Assistant:

bool HandleRegexCommand(std::vector<std::string> const& args,
                        cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("sub-command REGEX requires a mode to be specified.");
    return false;
  }
  std::string const& mode = args[1];
  if (mode == "MATCH") {
    if (args.size() < 5) {
      status.SetError("sub-command REGEX, mode MATCH needs "
                      "at least 5 arguments total to command.");
      return false;
    }
    return RegexMatch(args, status);
  }
  if (mode == "MATCHALL") {
    if (args.size() < 5) {
      status.SetError("sub-command REGEX, mode MATCHALL needs "
                      "at least 5 arguments total to command.");
      return false;
    }
    return RegexMatchAll(args, status);
  }
  if (mode == "REPLACE") {
    if (args.size() < 6) {
      status.SetError("sub-command REGEX, mode REPLACE needs "
                      "at least 6 arguments total to command.");
      return false;
    }
    return RegexReplace(args, status);
  }

  std::string e = "sub-command REGEX does not recognize mode " + mode;
  status.SetError(e);
  return false;
}